

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_183::InfoCollector::handleBreakValue(InfoCollector *this,Expression *curr)

{
  Id IVar1;
  bool bVar2;
  Switch *cast;
  ulong uVar3;
  InfoCollector *local_28;
  
  IVar1 = curr->_id;
  local_28 = this;
  if (IVar1 < RethrowId) {
    if (IVar1 < TryId) {
      if (IVar1 != BreakId) {
        if (IVar1 == SwitchId) {
          BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                    ((anon_class_16_2_3f140c08 *)curr,(Name *)&local_28);
          if (curr[1].type.id == 0) {
            return;
          }
          uVar3 = 1;
          do {
            BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                      ((anon_class_16_2_3f140c08 *)curr,(Name *)&local_28);
            bVar2 = uVar3 < curr[1].type.id;
            uVar3 = (ulong)((int)uVar3 + 1);
          } while (bVar2);
          return;
        }
        if (IVar1 != InvalidId) {
          return;
        }
        goto LAB_006fbb69;
      }
    }
    else if (IVar1 != TryId) {
      if (IVar1 != TryTableId) {
        return;
      }
      if (*(long *)(curr + 4) == 0) {
        return;
      }
      uVar3 = 1;
      do {
        BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                  ((anon_class_16_2_3f140c08 *)curr,(Name *)&local_28);
        bVar2 = uVar3 < *(ulong *)(curr + 4);
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (bVar2);
      return;
    }
  }
  else {
    if (SuspendId < IVar1) {
      if (IVar1 == ResumeId) {
        if (curr[3].type.id == 0) {
          return;
        }
        uVar3 = 1;
        do {
          BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                    ((anon_class_16_2_3f140c08 *)curr,(Name *)&local_28);
          bVar2 = uVar3 < curr[3].type.id;
          uVar3 = (ulong)((int)uVar3 + 1);
        } while (bVar2);
        return;
      }
      if (IVar1 == ResumeThrowId) {
        if (curr[4].type.id == 0) {
          return;
        }
        uVar3 = 1;
        do {
          BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                    ((anon_class_16_2_3f140c08 *)curr,(Name *)&local_28);
          bVar2 = uVar3 < curr[4].type.id;
          uVar3 = (ulong)((int)uVar3 + 1);
        } while (bVar2);
        return;
      }
      if (IVar1 != NumExpressionIds) {
        return;
      }
LAB_006fbb69:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                         ,0x103);
    }
    if ((IVar1 != RethrowId) && (IVar1 != BrOnId)) {
      return;
    }
  }
  BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
            ((anon_class_16_2_3f140c08 *)curr,(Name *)&local_28);
  return;
}

Assistant:

void handleBreakValue(Expression* curr) {
    BranchUtils::operateOnScopeNameUsesAndSentValues(
      curr, [&](Name target, Expression* value) {
        if (value && isRelevant(value->type)) {
          for (Index i = 0; i < value->type.size(); i++) {
            // Breaks send the contents of the break value to the branch target
            // that the break goes to.
            info.links.push_back({ExpressionLocation{value, i},
                                  getBreakTargetLocation(target, i)});
          }
        }
      });
  }